

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

lua_Number numarith(lua_State *L,int op,lua_Number v1,lua_Number v2)

{
  double dVar1;
  lua_Number lVar2;
  
  lVar2 = 0.0;
  switch(op) {
  case 0:
    lVar2 = v1 + v2;
    break;
  case 1:
    lVar2 = v1 - v2;
    break;
  case 2:
    lVar2 = v1 * v2;
    break;
  case 3:
    lVar2 = luaV_modf(L,v1,v2);
    return lVar2;
  case 4:
    if ((v2 != 2.0) || (NAN(v2))) {
      dVar1 = pow(v1,v2);
      return dVar1;
    }
    lVar2 = v1 * v1;
    break;
  case 5:
    lVar2 = v1 / v2;
    break;
  case 6:
    dVar1 = floor(v1 / v2);
    return dVar1;
  case 0xc:
    lVar2 = -v1;
  }
  return lVar2;
}

Assistant:

static lua_Number numarith (lua_State *L, int op, lua_Number v1,
                                                  lua_Number v2) {
  switch (op) {
    case LUA_OPADD: return luai_numadd(L, v1, v2);
    case LUA_OPSUB: return luai_numsub(L, v1, v2);
    case LUA_OPMUL: return luai_nummul(L, v1, v2);
    case LUA_OPDIV: return luai_numdiv(L, v1, v2);
    case LUA_OPPOW: return luai_numpow(L, v1, v2);
    case LUA_OPIDIV: return luai_numidiv(L, v1, v2);
    case LUA_OPUNM: return luai_numunm(L, v1);
    case LUA_OPMOD: return luaV_modf(L, v1, v2);
    default: lua_assert(0); return 0;
  }
}